

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

int lyb_is_schema_hash_match(lys_node *sibling,uint8_t *hash,uint8_t hash_count)

{
  uint8_t uVar1;
  byte local_23;
  uint8_t i;
  uint8_t sibling_hash;
  uint8_t hash_count_local;
  uint8_t *hash_local;
  lys_node *sibling_local;
  
  local_23 = 0;
  while( true ) {
    if (hash_count <= local_23) {
      return 1;
    }
    uVar1 = lyb_hash(sibling,local_23);
    if (uVar1 != hash[local_23]) break;
    local_23 = local_23 + 1;
  }
  return 0;
}

Assistant:

static int
lyb_is_schema_hash_match(struct lys_node *sibling, LYB_HASH *hash, uint8_t hash_count)
{
    LYB_HASH sibling_hash;
    uint8_t i;

    /* compare all the hashes starting from collision ID 0 */
    for (i = 0; i < hash_count; ++i) {
        sibling_hash = lyb_hash(sibling, i);
        if (sibling_hash != hash[i]) {
            return 0;
        }
    }

    return 1;
}